

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

void pty_pre_init(void)

{
  __uid_t _Var1;
  __uid_t _Var2;
  __gid_t _Var3;
  __gid_t _Var4;
  int iVar5;
  uint uVar6;
  ssize_t sVar7;
  size_t local_158;
  int uid;
  int gid;
  int ret;
  int dlen;
  char buffer [128];
  char display [128];
  int local_1c;
  int local_18;
  int pipefd [2];
  pid_t pid;
  Pty *pty;
  
  single_pty = new_pty_struct();
  unique0x100004f7 = single_pty;
  pty_setup_sigchld_handler();
  stack0xfffffffffffffff0->slave_fd = -1;
  stack0xfffffffffffffff0->master_fd = -1;
  pty_stamped_utmp = false;
  _Var1 = geteuid();
  _Var2 = getuid();
  if (_Var1 == _Var2) {
    _Var3 = getegid();
    _Var4 = getgid();
    if (_Var3 == _Var4) goto LAB_00113376;
  }
  pty_open_master(stack0xfffffffffffffff0);
  iVar5 = pipe(&local_1c);
  if (iVar5 < 0) {
    perror("pterm: pipe");
    exit(1);
  }
  cloexec(local_1c);
  cloexec(local_18);
  pipefd[0] = fork();
  if (pipefd[0] < 0) {
    perror("pterm: fork");
    exit(1);
  }
  if (pipefd[0] == 0) {
    close(local_18);
    while( true ) {
      sVar7 = read(local_1c,&ret,0x80);
      uVar6 = (uint)sVar7;
      if ((int)uVar6 < 1) break;
      if ((pty_stamped_utmp & 1U) == 0) {
        if (uVar6 < 0x80) {
          local_158 = (size_t)(int)uVar6;
        }
        else {
          local_158 = 0x80;
        }
        memcpy(buffer + 0x78,&ret,local_158);
        if (*(char *)((long)&ret + (long)(int)(uVar6 - 1)) == '\0') {
          putty_signal(1,fatal_sig_handler);
          putty_signal(2,fatal_sig_handler);
          putty_signal(3,fatal_sig_handler);
          putty_signal(4,fatal_sig_handler);
          putty_signal(6,fatal_sig_handler);
          putty_signal(8,fatal_sig_handler);
          putty_signal(0xd,fatal_sig_handler);
          putty_signal(0xe,fatal_sig_handler);
          putty_signal(0xf,fatal_sig_handler);
          putty_signal(0xb,fatal_sig_handler);
          putty_signal(10,fatal_sig_handler);
          putty_signal(0xc,fatal_sig_handler);
          putty_signal(7,fatal_sig_handler);
          putty_signal(0x1d,fatal_sig_handler);
          putty_signal(0x1b,fatal_sig_handler);
          putty_signal(0x1f,fatal_sig_handler);
          putty_signal(5,fatal_sig_handler);
          putty_signal(0x1a,fatal_sig_handler);
          putty_signal(0x18,fatal_sig_handler);
          putty_signal(0x19,fatal_sig_handler);
          putty_signal(0x1d,fatal_sig_handler);
          setup_utmp(stack0xfffffffffffffff0->name,buffer + 0x78);
        }
      }
    }
    cleanup_utmp();
    _exit(0);
  }
  close(local_1c);
  pty_utmp_helper_pid = pipefd[0];
  pty_utmp_helper_pipe = local_18;
LAB_00113376:
  _Var3 = getgid();
  _Var1 = getuid();
  iVar5 = setresgid(_Var3,_Var3,_Var3);
  if (iVar5 < 0) {
    perror("setresgid");
    exit(1);
  }
  iVar5 = setresuid(_Var1,_Var1,_Var1);
  if (iVar5 < 0) {
    perror("setresuid");
    exit(1);
  }
  return;
}

Assistant:

void pty_pre_init(void)
{
#ifndef NO_PTY_PRE_INIT

    Pty *pty;

#ifndef OMIT_UTMP
    pid_t pid;
    int pipefd[2];
#endif

    pty = single_pty = new_pty_struct();

    /* set the child signal handler straight away; it needs to be set
     * before we ever fork. */
    pty_setup_sigchld_handler();
    pty->master_fd = pty->slave_fd = -1;
#ifndef OMIT_UTMP
    pty_stamped_utmp = false;
#endif

    if (geteuid() != getuid() || getegid() != getgid()) {
        pty_open_master(pty);

#ifndef OMIT_UTMP
        /*
         * Fork off the utmp helper.
         */
        if (pipe(pipefd) < 0) {
            perror("pterm: pipe");
            exit(1);
        }
        cloexec(pipefd[0]);
        cloexec(pipefd[1]);
        pid = fork();
        if (pid < 0) {
            perror("pterm: fork");
            exit(1);
        } else if (pid == 0) {
            char display[128], buffer[128];
            int dlen, ret;

            close(pipefd[1]);
            /*
             * Now sit here until we receive a display name from the
             * other end of the pipe, and then stamp utmp. Unstamp utmp
             * again, and exit, when the pipe closes.
             */

            dlen = 0;
            while (1) {

                ret = read(pipefd[0], buffer, lenof(buffer));
                if (ret <= 0) {
                    cleanup_utmp();
                    _exit(0);
                } else if (!pty_stamped_utmp) {
                    if (dlen < lenof(display))
                        memcpy(display+dlen, buffer,
                               min(ret, lenof(display)-dlen));
                    if (buffer[ret-1] == '\0') {
                        /*
                         * Now we have a display name. NUL-terminate
                         * it, and stamp utmp.
                         */
                        display[lenof(display)-1] = '\0';
                        /*
                         * Trap as many fatal signals as we can in the
                         * hope of having the best possible chance to
                         * clean up utmp before termination. We are
                         * unfortunately unprotected against SIGKILL,
                         * but that's life.
                         */
                        putty_signal(SIGHUP, fatal_sig_handler);
                        putty_signal(SIGINT, fatal_sig_handler);
                        putty_signal(SIGQUIT, fatal_sig_handler);
                        putty_signal(SIGILL, fatal_sig_handler);
                        putty_signal(SIGABRT, fatal_sig_handler);
                        putty_signal(SIGFPE, fatal_sig_handler);
                        putty_signal(SIGPIPE, fatal_sig_handler);
                        putty_signal(SIGALRM, fatal_sig_handler);
                        putty_signal(SIGTERM, fatal_sig_handler);
                        putty_signal(SIGSEGV, fatal_sig_handler);
                        putty_signal(SIGUSR1, fatal_sig_handler);
                        putty_signal(SIGUSR2, fatal_sig_handler);
#ifdef SIGBUS
                        putty_signal(SIGBUS, fatal_sig_handler);
#endif
#ifdef SIGPOLL
                        putty_signal(SIGPOLL, fatal_sig_handler);
#endif
#ifdef SIGPROF
                        putty_signal(SIGPROF, fatal_sig_handler);
#endif
#ifdef SIGSYS
                        putty_signal(SIGSYS, fatal_sig_handler);
#endif
#ifdef SIGTRAP
                        putty_signal(SIGTRAP, fatal_sig_handler);
#endif
#ifdef SIGVTALRM
                        putty_signal(SIGVTALRM, fatal_sig_handler);
#endif
#ifdef SIGXCPU
                        putty_signal(SIGXCPU, fatal_sig_handler);
#endif
#ifdef SIGXFSZ
                        putty_signal(SIGXFSZ, fatal_sig_handler);
#endif
#ifdef SIGIO
                        putty_signal(SIGIO, fatal_sig_handler);
#endif
                        setup_utmp(pty->name, display);
                    }
                }
            }
        } else {
            close(pipefd[0]);
            pty_utmp_helper_pid = pid;
            pty_utmp_helper_pipe = pipefd[1];
        }
#endif
    }

    /* Drop privs. */
    {
#if HAVE_SETRESUID && HAVE_SETRESGID
        int gid = getgid(), uid = getuid();
        int setresgid(gid_t, gid_t, gid_t);
        int setresuid(uid_t, uid_t, uid_t);
        if (setresgid(gid, gid, gid) < 0) {
            perror("setresgid");
            exit(1);
        }
        if (setresuid(uid, uid, uid) < 0) {
            perror("setresuid");
            exit(1);
        }
#else
        if (setgid(getgid()) < 0) {
            perror("setgid");
            exit(1);
        }
        if (setuid(getuid()) < 0) {
            perror("setuid");
            exit(1);
        }
#endif
    }

#endif /* NO_PTY_PRE_INIT */

}